

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::adjustForUsageAndContext
          (LocaleDisplayNamesImpl *this,CapContextUsage usage,UnicodeString *result)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 c;
  Mutex local_28;
  Mutex lock;
  UnicodeString *result_local;
  CapContextUsage usage_local;
  LocaleDisplayNamesImpl *this_local;
  
  lock.fMutex = (UMutex *)result;
  iVar2 = UnicodeString::length(result);
  if (0 < iVar2) {
    c = UnicodeString::char32At((UnicodeString *)lock.fMutex,0);
    UVar1 = u_islower_63(c);
    if (((UVar1 != '\0') && (this->capitalizationBrkIter != (BreakIterator *)0x0)) &&
       ((this->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
        (this->fCapitalization[usage] != '\0')))) {
      Mutex::Mutex(&local_28,(UMutex *)capitalizationBrkIterLock);
      UnicodeString::toTitle
                ((UnicodeString *)lock.fMutex,this->capitalizationBrkIter,&this->locale,0x300);
      Mutex::~Mutex(&local_28);
    }
  }
  return (UnicodeString *)lock.fMutex;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::adjustForUsageAndContext(CapContextUsage usage,
                                                UnicodeString& result) const {
#if !UCONFIG_NO_BREAK_ITERATION
    // check to see whether we need to titlecase result
    if ( result.length() > 0 && u_islower(result.char32At(0)) && capitalizationBrkIter!= NULL &&
          ( capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE || fCapitalization[usage] ) ) {
        // note fCapitalization[usage] won't be set unless capitalizationContext is UI_LIST_OR_MENU or STANDALONE
        Mutex lock(&capitalizationBrkIterLock);
        result.toTitle(capitalizationBrkIter, locale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
    }
#endif
    return result;
}